

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O3

void initialize_proxy_list(char **proxies_str_list,int count,download_status *status)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *__s;
  size_t sVar3;
  _Node *p_Var4;
  ulong uVar5;
  proxy proxy_to_insert;
  proxy local_60;
  
  if (0 < count) {
    uVar5 = 0;
    do {
      __s = proxies_str_list[uVar5];
      sVar3 = strlen(__s);
      paVar2 = &local_60.address.field_2;
      local_60.address._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar3);
      local_60.index = (int)uVar5;
      local_60.speed = -1;
      p_Var4 = std::__cxx11::list<proxy,std::allocator<proxy>>::_M_create_node<proxy_const&>
                         ((list<proxy,std::allocator<proxy>> *)&status->globalProxyList,&local_60);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(status->globalProxyList).super__List_base<proxy,_std::allocator<proxy>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.address._M_dataplus._M_p != paVar2) {
        operator_delete(local_60.address._M_dataplus._M_p,
                        local_60.address.field_2._M_allocated_capacity + 1);
      }
      uVar5 = uVar5 + 1;
    } while ((uint)count != uVar5);
  }
  return;
}

Assistant:

void initialize_proxy_list(char **proxies_str_list, int count, download_status *status) {
    for (int i = 0; i < count; i++) {
        proxy proxy_to_insert = {string(proxies_str_list[i],strlen(proxies_str_list[i])), i};
        status->globalProxyList.insert(status->globalProxyList.end(), proxy_to_insert);
    }
}